

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.c
# Opt level: O0

axbStatus_t axbMatSetName(axbMat_s *mat,char *name)

{
  size_t sVar1;
  char *pcVar2;
  ulong local_28;
  size_t i;
  size_t len;
  char *name_local;
  axbMat_s *mat_local;
  
  sVar1 = strlen(name);
  if (mat->name_capacity < sVar1) {
    free(mat->name);
    pcVar2 = (char *)malloc(sVar1 + 2);
    mat->name = pcVar2;
  }
  for (local_28 = 0; local_28 <= sVar1; local_28 = local_28 + 1) {
    mat->name[local_28] = name[local_28];
  }
  return 0;
}

Assistant:

axbStatus_t axbMatSetName(struct axbMat_s *mat, const char *name)
{
  size_t len = strlen(name);
  if (len > mat->name_capacity) {
    free(mat->name);
    mat->name = malloc(len + 2);
  }
  for (size_t i=0; i<=len; ++i) mat->name[i] = name[i];
  return 0;
}